

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O2

void test_bson_json_infinity(void)

{
  uint uVar1;
  char cVar2;
  undefined8 uVar3;
  char *pcVar4;
  undefined **ppuVar5;
  double d;
  bson_t b;
  bson_error_t error;
  double local_388;
  undefined1 local_380 [200];
  uint local_2b8;
  uint local_2b4;
  char local_2b0 [640];
  
  for (ppuVar5 = &PTR_anon_var_dwarf_15fec_0014f3a0; *ppuVar5 != (undefined *)0x0;
      ppuVar5 = ppuVar5 + 1) {
    cVar2 = bson_init_from_json(local_380,*ppuVar5,0xffffffffffffffff,&local_2b8);
    if (cVar2 == '\0') {
      pcVar4 = "bson_init_from_json (&b, *j, -1, &error)";
      uVar3 = 0x8b5;
      goto LAB_0012761e;
    }
    uVar3 = bson_bcone_magic();
    cVar2 = bcon_extract(local_380,"d",uVar3,1,&local_388,0);
    if (cVar2 == '\0') {
      pcVar4 = "BCON_EXTRACT (&b, \"d\", BCONE_DOUBLE (d))";
      uVar3 = 0x8b6;
      goto LAB_0012761e;
    }
    if ((NAN(local_388)) || (!NAN(local_388 - local_388))) {
      pcVar4 = "d == d && ((d - d) != (d - d))";
      uVar3 = 0x8b8;
      goto LAB_0012761e;
    }
    bson_destroy(local_380);
  }
  for (ppuVar5 = &PTR_anon_var_dwarf_16010_0014f3c0; *ppuVar5 != (undefined *)0x0;
      ppuVar5 = ppuVar5 + 1) {
    cVar2 = bson_init_from_json(local_380,*ppuVar5,0xffffffffffffffff,&local_2b8);
    if (cVar2 == '\0') {
      pcVar4 = "bson_init_from_json (&b, *j, -1, &error)";
      uVar3 = 0x8bd;
      goto LAB_0012761e;
    }
    uVar3 = bson_bcone_magic();
    cVar2 = bcon_extract(local_380,"d",uVar3,1,&local_388,0);
    if (cVar2 == '\0') {
      pcVar4 = "BCON_EXTRACT (&b, \"d\", BCONE_DOUBLE (d))";
      uVar3 = 0x8be;
      goto LAB_0012761e;
    }
    if ((NAN(local_388)) || (!NAN(local_388 - local_388))) {
      pcVar4 = "d == d && ((d - d) != (d - d))";
      uVar3 = 0x8c0;
      goto LAB_0012761e;
    }
    if (0.0 <= local_388) {
      pcVar4 = "d < 0";
      uVar3 = 0x8c1;
      goto LAB_0012761e;
    }
    bson_destroy(local_380);
  }
  ppuVar5 = &PTR_anon_var_dwarf_16034_0014f3e0;
  do {
    if (*ppuVar5 == (undefined *)0x0) {
      ppuVar5 = &PTR_anon_var_dwarf_16094_0014f430;
      goto LAB_001273e7;
    }
    cVar2 = bson_init_from_json(local_380,*ppuVar5,0xffffffffffffffff,&local_2b8);
    if (cVar2 != '\0') {
      pcVar4 = "!bson_init_from_json (&b, *j, -1, &error)";
      uVar3 = 0x8c6;
      goto LAB_0012761e;
    }
    uVar1 = local_2b8;
    if ((local_2b8 != 1) || (uVar1 = local_2b4, local_2b4 != 1)) {
      uVar3 = 0x8ca;
      goto LAB_00127692;
    }
    pcVar4 = strstr(local_2b0,"Got parse error at");
    ppuVar5 = ppuVar5 + 1;
  } while (pcVar4 != (char *)0x0);
  pcVar4 = "Got parse error at";
LAB_00127456:
  fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",local_2b0,pcVar4);
  abort();
LAB_001273e7:
  do {
    if (*ppuVar5 == (undefined *)0x0) {
      return;
    }
    cVar2 = bson_init_from_json(local_380,*ppuVar5,0xffffffffffffffff,&local_2b8);
    if (cVar2 != '\0') {
      pcVar4 = "!bson_init_from_json (&b, *j, -1, &error)";
      uVar3 = 0x8ce;
LAB_0012761e:
      fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c"
              ,uVar3,"test_bson_json_infinity",pcVar4);
      abort();
    }
    uVar1 = local_2b8;
    if ((local_2b8 != 1) || (uVar1 = local_2b4, local_2b4 != 1)) {
      uVar3 = 0x8d2;
LAB_00127692:
      fprintf(_stderr,"FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n",(ulong)uVar1,"==",1,
              "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c"
              ,uVar3,"test_bson_json_infinity");
      abort();
    }
    pcVar4 = strstr(local_2b0,"Incomplete JSON");
    ppuVar5 = ppuVar5 + 1;
  } while (pcVar4 != (char *)0x0);
  pcVar4 = "Incomplete JSON";
  goto LAB_00127456;
}

Assistant:

static void
test_bson_json_infinity (void)
{
   bson_error_t error;
   bson_t b;
   double d;

   /* should parse any capitalization of Infinity */
   const char *infs[] = {"{ \"d\": Infinity }",
                         "{ \"d\": infinity }",
                         "{ \"d\": inFINIty }",
                         NULL};

   const char *negs[] = {"{ \"d\": -Infinity }",
                         "{ \"d\": -infinity }",
                         "{ \"d\": -inFINIty }",
                         NULL};

   const char *bad[] = {"{ \"d\": Infinityy }",
                        "{ \"d\": Infinit }",
                        "{ \"d\": -Infinityy }",
                        "{ \"d\": -Infinit }",
                        "{ \"d\": infinityy }",
                        "{ \"d\": infinit }",
                        "{ \"d\": -infinityy }",
                        "{ \"d\": -infinit }",
                        NULL};

   const char *partial[] = {"{ \"d\": In", "{ \"d\": I", "{ \"d\": i", NULL};
   const char **j;

   for (j = infs; *j; j++) {
      BSON_ASSERT (bson_init_from_json (&b, *j, -1, &error));
      BSON_ASSERT (BCON_EXTRACT (&b, "d", BCONE_DOUBLE (d)));
      /* Infinite */
      BSON_ASSERT (d == d && ((d - d) != (d - d)));
      bson_destroy (&b);
   }

   for (j = negs; *j; j++) {
      BSON_ASSERT (bson_init_from_json (&b, *j, -1, &error));
      BSON_ASSERT (BCON_EXTRACT (&b, "d", BCONE_DOUBLE (d)));
      /* Infinite */
      BSON_ASSERT (d == d && ((d - d) != (d - d)));
      BSON_ASSERT (d < 0);
      bson_destroy (&b);
   }

   for (j = bad; *j; j++) {
      BSON_ASSERT (!bson_init_from_json (&b, *j, -1, &error));
      ASSERT_ERROR_CONTAINS (error,
                             BSON_ERROR_JSON,
                             BSON_JSON_ERROR_READ_CORRUPT_JS,
                             "Got parse error at");
   }

   for (j = partial; *j; j++) {
      BSON_ASSERT (!bson_init_from_json (&b, *j, -1, &error));
      ASSERT_ERROR_CONTAINS (error,
                             BSON_ERROR_JSON,
                             BSON_JSON_ERROR_READ_CORRUPT_JS,
                             "Incomplete JSON");
   }
}